

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t farmhash32_su_with_seed(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  ulong in_RSI;
  uint32_t h;
  size_t in_stack_00000268;
  char *in_stack_00000270;
  uint32_t in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RSI < 0x19) {
    if (in_RSI < 0xd) {
      if (in_RSI < 5) {
        uVar1 = farmhash32_mk_len_0_to_4
                          ((char *)CONCAT44(seed,h),
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_stack_fffffffffffffff4);
      }
      else {
        uVar1 = farmhash32_mk_len_5_to_12
                          ((char *)CONCAT44(seed,h),
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_stack_fffffffffffffff4);
      }
    }
    else {
      uVar1 = farmhash32_mk_len_13_to_24
                        ((char *)CONCAT44(seed,h),
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_stack_fffffffffffffff4);
    }
  }
  else {
    uVar1 = farmhash32_mk_len_13_to_24
                      ((char *)CONCAT44(seed,h),
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_stack_fffffffffffffff4);
    uVar2 = farmhash32_su(in_stack_00000270,in_stack_00000268);
    uVar1 = crc32(uVar2 + in_EDX,uVar1);
  }
  return uVar1;
}

Assistant:

uint32_t farmhash32_su_with_seed(const char *s, size_t len, uint32_t seed) {
  if (len <= 24) {
    if (len >= 13) return farmhash32_mk_len_13_to_24(s, len, seed * c1);
    else if (len >= 5) return farmhash32_mk_len_5_to_12(s, len, seed);
    else return farmhash32_mk_len_0_to_4(s, len, seed);
  }
  uint32_t h = farmhash32_mk_len_13_to_24(s, 24, seed ^ len);
  return _mm_crc32_u32(farmhash32_su(s + 24, len - 24) + seed, h);
}